

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O2

unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
__thiscall
wabt::MakeUnique<wabt::DataSegmentModuleField,wabt::Location&,std::__cxx11::string&>
          (wabt *this,Location *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  string_view name;
  DataSegmentModuleField *this_00;
  
  this_00 = (DataSegmentModuleField *)operator_new(0xe0);
  name.data_ = (args_1->_M_dataplus)._M_p;
  name.size_ = args_1->_M_string_length;
  DataSegmentModuleField::DataSegmentModuleField(this_00,args,name);
  *(DataSegmentModuleField **)this = this_00;
  return (__uniq_ptr_data<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>,_true,_true>
          )(__uniq_ptr_data<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}